

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecAssignment(Parser *this)

{
  pointer pcVar1;
  CompileContext *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_88 [16];
  TokenType local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  size_type local_60;
  size_t sStack_58;
  line_t local_50;
  col_t local_4c;
  size_type local_30 [3];
  
  parsePrecLogicalOr((Parser *)local_88);
  if ((in_RSI->m_current).type == EQUAL) {
    advance(in_RSI);
    local_78 = (in_RSI->m_previous).type;
    pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_70._M_allocated_capacity = (size_type)&local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
    local_4c = (in_RSI->m_previous).col;
    local_50 = (in_RSI->m_previous).line;
    parsePrecAssignment((Parser *)(local_88 + 8));
    pCVar2 = (CompileContext *)operator_new(0x48);
    if ((size_type *)local_70._M_allocated_capacity == &local_60) {
      local_30[1] = sStack_58;
      local_70._M_allocated_capacity = (size_type)local_30;
    }
    (pCVar2->m_source)._M_dataplus._M_p = (pointer)&PTR__AssignExpr_00127498;
    (pCVar2->m_source)._M_string_length = local_88._0_8_;
    (pCVar2->m_source).field_2._M_allocated_capacity = local_88._8_8_;
    *(TokenType *)((long)&(pCVar2->m_source).field_2 + 8) = local_78;
    paVar3 = &(pCVar2->m_options).m_filename.field_2;
    (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)paVar3;
    if ((size_type *)local_70._M_allocated_capacity == local_30) {
      paVar3->_M_allocated_capacity = local_60;
      *(size_type *)((long)&(pCVar2->m_options).m_filename.field_2 + 8) = local_30[1];
    }
    else {
      (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)local_70._M_allocated_capacity;
      (pCVar2->m_options).m_filename.field_2._M_allocated_capacity = local_60;
    }
    (pCVar2->m_options).m_filename._M_string_length = local_70._8_8_;
    *(line_t *)
     &(pCVar2->m_options).m_programArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_50;
    *(col_t *)((long)&(pCVar2->m_options).m_programArgs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = local_4c;
    this->m_context = pCVar2;
  }
  else {
    this->m_context = (CompileContext *)local_88._0_8_;
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecAssignment() {
        std::unique_ptr<Expr> expr = parsePrecLogicalOr();

        if (consume(TokenType::EQUAL)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecAssignment(); // Right-associative
            return std::make_unique<AssignExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }